

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O1

void __thiscall Pl_Function::~Pl_Function(Pl_Function *this)

{
  ~Pl_Function(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Function::~Pl_Function() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}